

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::android::testMandatoryExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  char *pcVar1;
  bool bVar2;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  PlatformInterface *vkp;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  string local_2a8;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  Maybe<unsigned_int> local_240;
  Maybe<unsigned_int> local_230;
  allocator<char> local_219;
  string local_218;
  RequiredExtension local_1f8;
  int local_1b4;
  undefined1 local_1b0 [4];
  int ndx_1;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> extensions_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  Maybe<unsigned_int> local_150;
  Maybe<unsigned_int> local_140;
  allocator<char> local_129;
  string local_128;
  RequiredExtension local_108;
  int local_c4;
  undefined1 local_c0 [4];
  int ndx;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> extensions;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector results;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  vkp = Context::getPlatformInterface(context);
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             local_c0,vkp,(char *)0x0);
  for (local_c4 = 0; local_c4 < 1; local_c4 = local_c4 + 1) {
    pcVar1 = testMandatoryExtensions::mandatoryExtensions[local_c4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,pcVar1,&local_129);
    tcu::nothing<unsigned_int>();
    tcu::nothing<unsigned_int>();
    ::vk::RequiredExtension::RequiredExtension(&local_108,&local_128,&local_140,&local_150);
    bVar2 = ::vk::isExtensionSupported
                      ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        *)local_c0,&local_108);
    ::vk::RequiredExtension::~RequiredExtension(&local_108);
    tcu::Maybe<unsigned_int>::~Maybe(&local_150);
    tcu::Maybe<unsigned_int>::~Maybe(&local_140);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar1 = testMandatoryExtensions::mandatoryExtensions[local_c4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,pcVar1,
                 (allocator<char> *)
                 ((long)&extensions_1.
                         super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_170,&local_190," is not supported");
      tcu::ResultCollector::fail((ResultCollector *)local_70,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&extensions_1.
                         super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             local_c0);
  vki = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             local_1b0,vki,physicalDevice,(char *)0x0);
  for (local_1b4 = 0; local_1b4 < 1; local_1b4 = local_1b4 + 1) {
    pcVar1 = api::(anonymous_namespace)::android::testMandatoryExtensions(vkt::Context&)::
             mandatoryExtensions[local_1b4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar1,&local_219);
    tcu::nothing<unsigned_int>();
    tcu::nothing<unsigned_int>();
    ::vk::RequiredExtension::RequiredExtension(&local_1f8,&local_218,&local_230,&local_240);
    bVar2 = ::vk::isExtensionSupported
                      ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        *)local_1b0,&local_1f8);
    ::vk::RequiredExtension::~RequiredExtension(&local_1f8);
    tcu::Maybe<unsigned_int>::~Maybe(&local_240);
    tcu::Maybe<unsigned_int>::~Maybe(&local_230);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar1 = api::(anonymous_namespace)::android::testMandatoryExtensions(vkt::Context&)::
               mandatoryExtensions[local_1b4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pcVar1,&local_281);
      std::operator+(&local_260,&local_280," is not supported");
      tcu::ResultCollector::fail((ResultCollector *)local_70,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
    }
  }
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             local_1b0);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_2a8,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testMandatoryExtensions (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	// Instance extensions
	{
		static const char*					mandatoryExtensions[]	=
		{
			"VK_KHR_get_physical_device_properties2",
		};
		const vector<VkExtensionProperties>	extensions				= enumerateInstanceExtensionProperties(context.getPlatformInterface(), DE_NULL);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(mandatoryExtensions); ++ndx)
		{
			if (!isExtensionSupported(extensions, RequiredExtension(mandatoryExtensions[ndx])))
				results.fail(string(mandatoryExtensions[ndx]) + " is not supported");
		}
	}

	// Device extensions
	{
		static const char*					mandatoryExtensions[]	=
		{
			"VK_KHR_maintenance1",
		};
		const vector<VkExtensionProperties>	extensions				= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(mandatoryExtensions); ++ndx)
		{
			if (!isExtensionSupported(extensions, RequiredExtension(mandatoryExtensions[ndx])))
				results.fail(string(mandatoryExtensions[ndx]) + " is not supported");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}